

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::StringIsFlatbufferPositiveInfinity(string *s)

{
  bool bVar1;
  bool local_11;
  string *s_local;
  
  bVar1 = std::operator==(s,"inf");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(s,"+inf");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(s,"infinity");
      local_11 = true;
      if (!bVar1) {
        local_11 = std::operator==(s,"+infinity");
      }
    }
  }
  return local_11;
}

Assistant:

inline bool StringIsFlatbufferPositiveInfinity(const std::string &s) {
  return s == "inf" || s == "+inf" || s == "infinity" || s == "+infinity";
}